

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_RightAlign_Test::TestBody(FormatterTest_RightAlign_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  char (*in_stack_fffffffffffffab8) [6];
  string *expected;
  char *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  int line;
  char *in_stack_fffffffffffffad0;
  string *file;
  undefined8 in_stack_fffffffffffffad8;
  Type type;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  char (*in_stack_fffffffffffffae8) [8];
  string *format_str;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  AssertHelper *in_stack_fffffffffffffb30;
  AssertHelper *this_00;
  string local_3f0 [32];
  AssertionResult local_3d0 [2];
  string local_3b0 [32];
  AssertionResult local_390 [2];
  undefined1 local_369;
  string local_368 [32];
  AssertionResult local_348 [2];
  longdouble local_328;
  string local_318 [32];
  AssertionResult local_2f8 [2];
  undefined8 local_2d8;
  string local_2d0 [32];
  AssertionResult local_2b0 [2];
  undefined8 local_290;
  AssertHelper local_288 [4];
  AssertionResult local_268 [2];
  undefined8 local_248;
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined8 local_200;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined8 local_1b8;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined4 local_16c;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined4 local_124;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  local_3c = 0x2a;
  fmt::v5::format<char[7],int>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (int *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,(char (*) [5])in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x137b5a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x137bbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137c15);
  local_94 = 0x22;
  fmt::v5::format<char[8],int>
            (in_stack_fffffffffffffae8,
             (int *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,(char (*) [5])in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x137d12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x137d75);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137dcd);
  local_dc = 0x42;
  fmt::v5::format<char[8],int>
            (in_stack_fffffffffffffae8,
             (int *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,(char (*) [5])in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x137eca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x137f2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137f85);
  local_124 = 0xffffffd6;
  fmt::v5::format<char[7],int>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (int *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x138082);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x1380e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13813d);
  local_16c = 0x2a;
  fmt::v5::format<char[7],unsigned_int>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (uint *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x13823a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x13829d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1382f5);
  local_1b8 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (long *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1383f3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x138456);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1384ae);
  local_200 = 0x2a;
  fmt::v5::format<char[7],unsigned_long>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1385ac);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x13860f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138667);
  local_248 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long_long>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (longlong *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x138765);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb30,
               (Message *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x1387c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138820);
  local_290 = 0x2a;
  this_00 = local_288;
  fmt::v5::format<char[7],unsigned_long_long>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (unsigned_long_long *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string((string *)local_288);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x13891e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x13897b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1389d3);
  local_2d8 = 0xc045000000000000;
  fmt::v5::format<char[7],double>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (double *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x138acb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x138b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138b80);
  local_328 = (longdouble)-42.0;
  fmt::v5::format<char[7],long_double>
            ((char (*) [7])in_stack_fffffffffffffae8,
             (longdouble *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x138c73);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x138cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138d28);
  local_369 = 99;
  format_str = local_368;
  fmt::v5::format<char[7],char>
            ((char (*) [7])format_str,
             (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_368);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffae0));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x138e16);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffae0),type,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x138e73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138ecb);
  file = local_3b0;
  fmt::v5::format<char[7],char[4]>
            ((char (*) [7])format_str,(char (*) [4])CONCAT17(uVar3,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_390);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffacc);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffae0));
    in_stack_fffffffffffffac0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x138fb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffae0),type,(char *)file,line,
               in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x13900d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139065);
  expected = local_3f0;
  fmt::v5::format<char[7],void*>
            ((char (*) [7])format_str,(void **)CONCAT17(uVar3,in_stack_fffffffffffffae0));
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffac8),in_stack_fffffffffffffac0,
             (char (*) [9])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
  std::__cxx11::string::~string(local_3f0);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffae0));
    testing::AssertionResult::failure_message((AssertionResult *)0x139157);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffae0),type,(char *)file,line,
               in_stack_fffffffffffffac0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffb28));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffab0));
    testing::Message::~Message((Message *)0x1391b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139207);
  return;
}

Assistant:

TEST(FormatterTest, RightAlign) {
  EXPECT_EQ("  42", format("{0:>4}", 42));
  EXPECT_EQ("  42", format("{0:>4o}", 042));
  EXPECT_EQ("  42", format("{0:>4x}", 0x42));
  EXPECT_EQ("  -42", format("{0:>5}", -42));
  EXPECT_EQ("   42", format("{0:>5}", 42u));
  EXPECT_EQ("  -42", format("{0:>5}", -42l));
  EXPECT_EQ("   42", format("{0:>5}", 42ul));
  EXPECT_EQ("  -42", format("{0:>5}", -42ll));
  EXPECT_EQ("   42", format("{0:>5}", 42ull));
  EXPECT_EQ("  -42", format("{0:>5}", -42.0));
  EXPECT_EQ("  -42", format("{0:>5}", -42.0l));
  EXPECT_EQ("    c", format("{0:>5}", 'c'));
  EXPECT_EQ("  abc", format("{0:>5}", "abc"));
  EXPECT_EQ("  0xface", format("{0:>8}", reinterpret_cast<void*>(0xface)));
}